

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_sign.c
# Opt level: O0

int i2d_DSA_SIG(DSA_SIG *a,uchar **pp)

{
  int iVar1;
  WPACKET pkt;
  size_t encoded_len;
  BUF_MEM *buf;
  WPACKET *in_stack_ffffffffffffff98;
  WPACKET *in_stack_ffffffffffffffa0;
  WPACKET *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  uchar *in_stack_ffffffffffffffc0;
  WPACKET *in_stack_ffffffffffffffc8;
  size_t local_28;
  BUF_MEM *local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_20 = (BUF_MEM *)0x0;
  if (pp == (uchar **)0x0) {
    iVar1 = WPACKET_init_null(in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
    if (iVar1 == 0) {
      return -1;
    }
  }
  else if (*pp == (uchar *)0x0) {
    local_20 = BUF_MEM_new();
    if ((local_20 == (BUF_MEM *)0x0) ||
       (iVar1 = WPACKET_init_len(in_stack_ffffffffffffffa8,(BUF_MEM *)in_stack_ffffffffffffffa0,
                                 (size_t)in_stack_ffffffffffffff98), iVar1 == 0)) {
      BUF_MEM_free(local_20);
      return -1;
    }
  }
  else {
    iVar1 = WPACKET_init_static_len
                      (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8
                       ,in_stack_ffffffffffffffb0);
    if (iVar1 == 0) {
      return -1;
    }
  }
  iVar1 = ossl_encode_der_dsa_sig
                    ((WPACKET *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (BIGNUM *)a,(BIGNUM *)pp);
  if (((iVar1 == 0) ||
      (iVar1 = WPACKET_get_total_written((WPACKET *)&stack0xffffffffffffffa0,&local_28), iVar1 == 0)
      ) || (iVar1 = WPACKET_finish(in_stack_ffffffffffffff98), iVar1 == 0)) {
    BUF_MEM_free(local_20);
    WPACKET_cleanup(in_stack_ffffffffffffffa0);
    iVar1 = -1;
  }
  else {
    if ((BIGNUM *)pp != (BIGNUM *)0x0) {
      if (((BIGNUM *)pp)->d == (unsigned_long *)0x0) {
        ((BIGNUM *)pp)->d = (unsigned_long *)local_20->data;
        local_20->data = (char *)0x0;
        BUF_MEM_free(local_20);
      }
      else {
        ((BIGNUM *)pp)->d = (unsigned_long *)(local_28 + (long)((BIGNUM *)pp)->d);
      }
    }
    iVar1 = (int)local_28;
  }
  return iVar1;
}

Assistant:

int i2d_DSA_SIG(const DSA_SIG *sig, unsigned char **ppout)
{
    BUF_MEM *buf = NULL;
    size_t encoded_len;
    WPACKET pkt;

    if (ppout == NULL) {
        if (!WPACKET_init_null(&pkt, 0))
            return -1;
    } else if (*ppout == NULL) {
        if ((buf = BUF_MEM_new()) == NULL
                || !WPACKET_init_len(&pkt, buf, 0)) {
            BUF_MEM_free(buf);
            return -1;
        }
    } else {
        if (!WPACKET_init_static_len(&pkt, *ppout, SIZE_MAX, 0))
            return -1;
    }

    if (!ossl_encode_der_dsa_sig(&pkt, sig->r, sig->s)
            || !WPACKET_get_total_written(&pkt, &encoded_len)
            || !WPACKET_finish(&pkt)) {
        BUF_MEM_free(buf);
        WPACKET_cleanup(&pkt);
        return -1;
    }

    if (ppout != NULL) {
        if (*ppout == NULL) {
            *ppout = (unsigned char *)buf->data;
            buf->data = NULL;
            BUF_MEM_free(buf);
        } else {
            *ppout += encoded_len;
        }
    }

    return (int)encoded_len;
}